

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfsemulatorintegration.cpp
# Opt level: O0

void __thiscall QEglFSEmulatorIntegration::screenInit(QEglFSEmulatorIntegration *this)

{
  bool bVar1;
  ulong uVar2;
  QDebug *pQVar3;
  QJsonArray *in_RDI;
  long in_FS_OFFSET;
  QJsonArray *__range4;
  QJsonValueRef screenValue;
  iterator __end4;
  iterator __begin4;
  QJsonArray screenArray;
  QJsonDocument displaysDocument;
  QJsonParseError error;
  QByteArray displaysInfo;
  QJsonObject *in_stack_ffffffffffffff08;
  int t;
  QEglFSEmulatorScreen *in_stack_ffffffffffffff10;
  QDebug *in_stack_ffffffffffffff20;
  QJsonArray *this_00;
  char local_d0 [40];
  char *in_stack_ffffffffffffff58;
  QDebug local_78 [8];
  QJsonObject local_70 [8];
  QJsonValueConstRef local_68;
  QJsonValueConstRef local_58;
  anon_union_8_3_4e90986c_for_QJsonValueConstRef_0 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  qsizetype local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 8) == 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_ffffffffffffff20,(char *)in_RDI,
               (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),(char *)in_stack_ffffffffffffff08);
    QMessageLogger::fatal(local_d0,"EGL library doesn\'t support Emulator extensions");
  }
  else {
    local_20[0] = -0x5555555555555556;
    local_20[1] = 0xaaaaaaaaaaaaaaaa;
    local_20[2] = 0xaaaaaaaaaaaaaaaa;
    this_00 = in_RDI;
    (**(code **)(in_RDI + 8))(local_20);
    local_30._8_8_ = (char *)0xaaaaaaaaaaaaaaaa;
    QJsonParseError::QJsonParseError((QJsonParseError *)(local_30 + 8));
    local_30._0_8_ = (Data *)0xaaaaaaaaaaaaaaaa;
    QJsonDocument::fromJson((QByteArray *)local_30,(QJsonParseError *)local_20);
    if (local_30._12_4_ == 0) {
      uVar2 = QJsonDocument::isArray();
      if ((uVar2 & 1) != 0) {
        local_38 = 0xaaaaaaaaaaaaaaaa;
        QJsonDocument::array();
        local_40 = 0xaaaaaaaaaaaaaaaa;
        local_48 = (anon_union_8_3_4e90986c_for_QJsonValueConstRef_0)0xaaaaaaaaaaaaaaaa;
        _local_48 = (QJsonValueConstRef)QJsonArray::begin(this_00);
        local_58._8_8_ = 0xaaaaaaaaaaaaaaaa;
        local_58.field_0.a = (QJsonArray *)0xaaaaaaaaaaaaaaaa;
        local_58 = (QJsonValueConstRef)QJsonArray::end(in_RDI);
        while (bVar1 = operator!=((iterator *)in_stack_ffffffffffffff10,
                                  (iterator *)in_stack_ffffffffffffff08), bVar1) {
          local_68._8_8_ = 0xaaaaaaaaaaaaaaaa;
          local_68.field_0.a = (QJsonArray *)0xaaaaaaaaaaaaaaaa;
          local_68 = (QJsonValueConstRef)QJsonArray::iterator::operator*((iterator *)in_RDI);
          bVar1 = QJsonValueRef::isObject((QJsonValueRef *)0x104a35);
          if (bVar1) {
            in_stack_ffffffffffffff10 = (QEglFSEmulatorScreen *)operator_new(0x78);
            QJsonValueRef::toObject();
            QEglFSEmulatorScreen::QEglFSEmulatorScreen
                      (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
            QWindowSystemInterface::handleScreenAdded
                      ((QPlatformScreen *)in_stack_ffffffffffffff10,false);
            QJsonObject::~QJsonObject(local_70);
          }
          QJsonArray::iterator::operator++((iterator *)&local_48);
        }
        QJsonArray::~QJsonArray((QJsonArray *)&local_38);
      }
    }
    else {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_ffffffffffffff20,(char *)in_RDI,
                 (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),(char *)in_stack_ffffffffffffff08);
      QMessageLogger::warning();
      pQVar3 = QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffff58);
      t = (int)((ulong)pQVar3 >> 0x20);
      QJsonParseError::errorString();
      QDebug::operator<<(in_stack_ffffffffffffff20,(QString *)in_RDI);
      QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffff58);
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffff10,t);
      QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffff58);
      QDebug::operator<<(in_stack_ffffffffffffff20,(QByteArray *)in_RDI);
      QString::~QString((QString *)0x104b54);
      QDebug::~QDebug(local_78);
    }
    QJsonDocument::~QJsonDocument((QJsonDocument *)local_30);
    QByteArray::~QByteArray((QByteArray *)0x104b7b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEglFSEmulatorIntegration::screenInit()
{
    // Use qgsGetDisplays() call to retrieve the available screens from the Emulator
    if (getDisplays) {
        QByteArray displaysInfo = getDisplays();
        QJsonParseError error;
        QJsonDocument displaysDocument = QJsonDocument::fromJson(displaysInfo, &error);
        if (error.error == QJsonParseError::NoError) {
            // Document should be an array of screen objects
            if (displaysDocument.isArray()){
                QJsonArray screenArray = displaysDocument.array();
                for (auto screenValue : screenArray) {
                    if (screenValue.isObject())
                        QWindowSystemInterface::handleScreenAdded(new QEglFSEmulatorScreen(screenValue.toObject()));
                }
            }
        } else {
            qWarning() << "eglfs_emu: Failed to parse display info JSON with error: " << error.errorString()
                       << " at offset " << error.offset << " : " << displaysInfo;

        }
    } else {
        qFatal("EGL library doesn't support Emulator extensions");
    }
}